

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_inv_txfm_avx2.c
# Opt level: O0

void load_buffer_avx2(int32_t *in,int stride,__m128i *out)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined8 *in_RDX;
  int in_ESI;
  undefined1 (*in_RDI) [32];
  __m256i gh;
  __m256i ef;
  __m256i cd;
  __m256i ab;
  __m256i gh_16bit;
  __m256i ef_16bit;
  __m256i cd_16bit;
  __m256i ab_16bit;
  __m256i h;
  __m256i g;
  __m256i f;
  __m256i e;
  __m256i d;
  __m256i c;
  __m256i b;
  __m256i a;
  undefined8 local_420;
  undefined8 uStack_418;
  undefined8 uStack_410;
  undefined8 uStack_408;
  undefined8 local_400;
  undefined8 uStack_3f8;
  undefined8 uStack_3f0;
  undefined8 uStack_3e8;
  undefined8 local_3e0;
  undefined8 uStack_3d8;
  undefined8 uStack_3d0;
  undefined8 uStack_3c8;
  undefined8 local_3c0;
  undefined8 uStack_3b8;
  undefined8 uStack_3b0;
  undefined8 uStack_3a8;
  
  auVar1 = vpackssdw_avx2(*in_RDI,*(undefined1 (*) [32])(*in_RDI + (long)in_ESI * 4));
  auVar2 = vpackssdw_avx2(*(undefined1 (*) [32])(*in_RDI + (long)(in_ESI * 2) * 4),
                          *(undefined1 (*) [32])(*in_RDI + (long)(in_ESI * 3) * 4));
  auVar3 = vpackssdw_avx2(*(undefined1 (*) [32])(*in_RDI + (long)(in_ESI << 2) * 4),
                          *(undefined1 (*) [32])(*in_RDI + (long)(in_ESI * 5) * 4));
  auVar4 = vpackssdw_avx2(*(undefined1 (*) [32])(*in_RDI + (long)(in_ESI * 6) * 4),
                          *(undefined1 (*) [32])(*in_RDI + (long)(in_ESI * 7) * 4));
  auVar1 = vpermq_avx2(auVar1,0xd8);
  auVar2 = vpermq_avx2(auVar2,0xd8);
  auVar3 = vpermq_avx2(auVar3,0xd8);
  auVar4 = vpermq_avx2(auVar4,0xd8);
  local_3c0 = auVar1._0_8_;
  uStack_3b8 = auVar1._8_8_;
  *in_RDX = local_3c0;
  in_RDX[1] = uStack_3b8;
  uStack_3b0 = auVar1._16_8_;
  uStack_3a8 = auVar1._24_8_;
  in_RDX[2] = uStack_3b0;
  in_RDX[3] = uStack_3a8;
  local_3e0 = auVar2._0_8_;
  uStack_3d8 = auVar2._8_8_;
  in_RDX[4] = local_3e0;
  in_RDX[5] = uStack_3d8;
  uStack_3d0 = auVar2._16_8_;
  uStack_3c8 = auVar2._24_8_;
  in_RDX[6] = uStack_3d0;
  in_RDX[7] = uStack_3c8;
  local_400 = auVar3._0_8_;
  uStack_3f8 = auVar3._8_8_;
  in_RDX[8] = local_400;
  in_RDX[9] = uStack_3f8;
  uStack_3f0 = auVar3._16_8_;
  uStack_3e8 = auVar3._24_8_;
  in_RDX[10] = uStack_3f0;
  in_RDX[0xb] = uStack_3e8;
  local_420 = auVar4._0_8_;
  uStack_418 = auVar4._8_8_;
  in_RDX[0xc] = local_420;
  in_RDX[0xd] = uStack_418;
  uStack_410 = auVar4._16_8_;
  uStack_408 = auVar4._24_8_;
  in_RDX[0xe] = uStack_410;
  in_RDX[0xf] = uStack_408;
  return;
}

Assistant:

static inline void load_buffer_avx2(const int32_t *in, int stride,
                                    __m128i *out) {
  const __m256i a = _mm256_load_si256((const __m256i *)in);
  const __m256i b = _mm256_load_si256((const __m256i *)(in + stride * 1));
  const __m256i c = _mm256_load_si256((const __m256i *)(in + stride * 2));
  const __m256i d = _mm256_load_si256((const __m256i *)(in + stride * 3));
  const __m256i e = _mm256_load_si256((const __m256i *)(in + stride * 4));
  const __m256i f = _mm256_load_si256((const __m256i *)(in + stride * 5));
  const __m256i g = _mm256_load_si256((const __m256i *)(in + stride * 6));
  const __m256i h = _mm256_load_si256((const __m256i *)(in + stride * 7));

  // a0 a1 a2 a3 b0 b1 b2 b3 a4 a5 a6 a7 b4 b5 b6 b7
  const __m256i ab_16bit = _mm256_packs_epi32(a, b);
  // c0 c1 c2 c3 d0 d1 d2 d3 c4 c5 c6 c7 d4 d5 d6 d7
  const __m256i cd_16bit = _mm256_packs_epi32(c, d);
  // e0 e1 e2 e3 f0 f1 f2 f3 e4 e5 e6 e7 f4 f5 f6 f7
  const __m256i ef_16bit = _mm256_packs_epi32(e, f);
  // g0 g1 g2 g3 h0 h1 h2 h3 g4 g5 g6 g7 h4 h5 h6 h7
  const __m256i gh_16bit = _mm256_packs_epi32(g, h);

  // a0 a1 a2 a3 a4 a5 a6 a7 b0 b1 b2 b3 b4 b5 b6 b7
  const __m256i ab = _mm256_permute4x64_epi64(ab_16bit, 0xd8);
  // c0 c1 c2 c3 c4 c5 c6 c7 d0 d1 d2 d3 d4 d5 d6 d7
  const __m256i cd = _mm256_permute4x64_epi64(cd_16bit, 0xd8);
  // e0 e1 e2 e3 e4 e5 e6 e7 f0 f1 f2 f3 f4 f5 f6 f7
  const __m256i ef = _mm256_permute4x64_epi64(ef_16bit, 0xd8);
  // g0 g1 g2 g3 g4 g5 g6 g7 h0 h1 h2 h3 h4 h5 h6 h7
  const __m256i gh = _mm256_permute4x64_epi64(gh_16bit, 0xd8);

  out[0] = _mm256_castsi256_si128(ab);
  out[1] = _mm256_extractf128_si256(ab, 1);
  out[2] = _mm256_castsi256_si128(cd);
  out[3] = _mm256_extractf128_si256(cd, 1);
  out[4] = _mm256_castsi256_si128(ef);
  out[5] = _mm256_extractf128_si256(ef, 1);
  out[6] = _mm256_castsi256_si128(gh);
  out[7] = _mm256_extractf128_si256(gh, 1);
}